

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_add_sample(bcf_hdr_t *h,char *s)

{
  khint_t kVar1;
  ushort **ppuVar2;
  char *key;
  void *pvVar3;
  bool bVar4;
  int n;
  int k;
  char *sdup;
  kh_vdict_t *pkStack_30;
  int ret;
  vdict_t *d;
  char *ss;
  char *s_local;
  bcf_hdr_t *h_local;
  
  d = (vdict_t *)s;
  ss = s;
  s_local = (char *)h;
  if (s == (char *)0x0) {
    h_local._4_4_ = 0;
  }
  else {
    while( true ) {
      bVar4 = false;
      if ((char)d->n_buckets == '\0') {
        ppuVar2 = __ctype_b_loc();
        bVar4 = ((*ppuVar2)[(int)(char)d->n_buckets] & 0x2000) != 0;
      }
      if (!bVar4) break;
      d = (vdict_t *)((long)&d->n_buckets + 1);
    }
    if ((char)d->n_buckets == '\0') {
      fprintf(_stderr,"[E::%s] Empty sample name: trailing spaces/tabs in the header line?\n",
              "bcf_hdr_add_sample");
      abort();
    }
    pkStack_30 = *(kh_vdict_t **)(s_local + 0x38);
    key = strdup(ss);
    kVar1 = kh_put_vdict(pkStack_30,key,(int *)((long)&sdup + 4));
    if (sdup._4_4_ == 0) {
      if (1 < hts_verbose) {
        fprintf(_stderr,"[E::%s] Duplicated sample name \'%s\'\n","bcf_hdr_add_sample",ss);
        abort();
      }
      free(key);
      h_local._4_4_ = -1;
    }
    else {
      memcpy(pkStack_30->vals + (int)kVar1,&bcf_idinfo_def,0x30);
      pkStack_30->vals[(int)kVar1].id = pkStack_30->size - 1;
      kVar1 = pkStack_30->size;
      pvVar3 = realloc(*(void **)(s_local + 0x40),(long)(int)kVar1 << 3);
      *(void **)(s_local + 0x40) = pvVar3;
      *(char **)(*(long *)(s_local + 0x40) + (long)(int)(kVar1 - 1) * 8) = key;
      s_local[0x54] = '\x01';
      s_local[0x55] = '\0';
      s_local[0x56] = '\0';
      s_local[0x57] = '\0';
      h_local._4_4_ = 0;
    }
  }
  return h_local._4_4_;
}

Assistant:

int bcf_hdr_add_sample(bcf_hdr_t *h, const char *s)
{
    if ( !s ) return 0;

    const char *ss = s;
    while ( !*ss && isspace(*ss) ) ss++;
    if ( !*ss )
    {
        fprintf(stderr,"[E::%s] Empty sample name: trailing spaces/tabs in the header line?\n", __func__);
        abort();
    }

    vdict_t *d = (vdict_t*)h->dict[BCF_DT_SAMPLE];
    int ret;
    char *sdup = strdup(s);
    int k = kh_put(vdict, d, sdup, &ret);
    if (ret) { // absent
        kh_val(d, k) = bcf_idinfo_def;
        kh_val(d, k).id = kh_size(d) - 1;
    } else {
        if (hts_verbose >= 2)
        {
            fprintf(stderr, "[E::%s] Duplicated sample name '%s'\n", __func__, s);
            abort();
        }
        free(sdup);
        return -1;
    }
    int n = kh_size(d);
    h->samples = (char**) realloc(h->samples,sizeof(char*)*n);
    h->samples[n-1] = sdup;
    h->dirty = 1;
    return 0;
}